

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::GeometryShaderAdjacencyTests
          (GeometryShaderAdjacencyTests *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderAdjacencyTests *this_local;
  
  TestCaseGroupBase::TestCaseGroupBase
            (&this->super_TestCaseGroupBase,context,extParams,name,description);
  (this->super_TestCaseGroupBase).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderAdjacencyTests_0326e5f8;
  this->m_grid_granulity = 1;
  this->m_n_components_input = 2;
  this->m_n_components_output = 4;
  this->m_n_line_segments = 4;
  this->m_n_vertices_per_triangle = 3;
  std::vector<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>::vector
            (&this->m_tests_data);
  return;
}

Assistant:

GeometryShaderAdjacencyTests::GeometryShaderAdjacencyTests(Context& context, const ExtParameters& extParams,
														   const char* name, const char* description)
	: TestCaseGroupBase(context, extParams, name, description)
	, m_grid_granulity(1)
	, m_n_components_input(2)
	, m_n_components_output(4)
	, m_n_line_segments(4)
	, m_n_vertices_per_triangle(3)
{
	/* Nothing to be done here */
}